

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void AddTSToSentList(SstStream Stream,WS_ReaderInfo Reader,ssize_t Timestep)

{
  undefined8 *puVar1;
  undefined8 in_RDX;
  long in_RSI;
  _SentTimestepRec *List;
  _SentTimestepRec *Item;
  long local_28;
  
  puVar1 = (undefined8 *)malloc(0x10);
  local_28 = *(long *)(in_RSI + 0x68);
  *puVar1 = in_RDX;
  puVar1[1] = 0;
  if (local_28 == 0) {
    *(undefined8 **)(in_RSI + 0x68) = puVar1;
  }
  else {
    for (; *(long *)(local_28 + 8) != 0; local_28 = *(long *)(local_28 + 8)) {
    }
    *(undefined8 **)(local_28 + 8) = puVar1;
  }
  return;
}

Assistant:

static void AddTSToSentList(SstStream Stream, WS_ReaderInfo Reader, ssize_t Timestep)
{
    struct _SentTimestepRec *Item = malloc(sizeof(*Item)), *List = Reader->SentTimestepList;
    Item->Timestep = Timestep;
    Item->Next = NULL;
    if (List == NULL)
    {
        Reader->SentTimestepList = Item;
    }
    else
    {
        while (List->Next != NULL)
        {
            List = List->Next;
        }
        List->Next = Item;
    }
}